

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O1

void helper_load_seg_x86_64(CPUX86State *env,int seg_reg,int selector)

{
  target_ulong *ptVar1;
  uint32_t uVar2;
  uint32_t val;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint mmu_idx;
  int exception_index;
  uint uVar6;
  abi_ptr aVar7;
  uint mmu_idx_00;
  uintptr_t unaff_retaddr;
  
  uVar3 = env->hflags;
  uVar6 = uVar3 & 3;
  uVar5 = selector & 0xfffc;
  if (uVar5 == 0) {
    if ((seg_reg == 2) && ((-1 < (short)uVar3 || (uVar6 == 3)))) {
      raise_exception_err_ra_x86_64(env,0xd,0,unaff_retaddr);
    }
    env->segs[seg_reg].selector = selector & 0xffffU;
    ptVar1 = &env->segs[seg_reg].base;
    *ptVar1 = 0;
    ptVar1[1] = 0;
    if (seg_reg != 2) {
      if (seg_reg == 1) {
        env->hflags = uVar3 & 0xffff7fef | env->segs[1].flags >> 0x12 & 0x10;
      }
      goto LAB_0051ef06;
    }
    *(byte *)&env->hflags = (byte)env->hflags & 0xfc;
LAB_0051eefe:
    cpu_sync_bndcs_hflags_x86_64(env);
LAB_0051ef06:
    uVar3 = env->hflags;
    uVar5 = env->segs[2].flags >> 0x11 & 0x20;
    if (-1 < (short)uVar3) {
      if ((((env->cr[0] & 1) == 0) || ((uVar3 & 0x10) == 0)) || ((env->eflags & 0x20000) != 0)) {
        uVar5 = uVar5 | 0x40;
      }
      else {
        uVar5 = uVar5 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                              env->segs[2].base != 0) << 6;
      }
    }
    env->hflags = uVar3 & 0xffffff9f | uVar5;
    return;
  }
  lVar4 = 0x148;
  if ((selector & 4U) == 0) {
    lVar4 = 0x178;
  }
  if (*(uint *)((long)env->regs + lVar4 + 0x10) < (selector & 0xfff8U) + 7) {
    raise_exception_err_ra_x86_64(env,0xd,uVar5,unaff_retaddr);
  }
  mmu_idx_00 = 2;
  mmu_idx = 2;
  aVar7 = (ulong)(selector & 0xfff8U) + *(long *)((long)env->regs + lVar4 + 8);
  if (((uVar3 >> 0x17 & 1) != 0) && (mmu_idx = 0, uVar6 != 3)) {
    mmu_idx = (uint)env->eflags >> 0x11 & 2;
  }
  uVar2 = cpu_ldl_mmuidx_ra_x86_64(env,aVar7,mmu_idx,unaff_retaddr);
  aVar7 = aVar7 + 4;
  if (((env->hflags >> 0x17 & 1) != 0) && (mmu_idx_00 = 0, (~env->hflags & 3) != 0)) {
    mmu_idx_00 = (uint)env->eflags >> 0x11 & 2;
  }
  val = cpu_ldl_mmuidx_ra_x86_64(env,aVar7,mmu_idx_00,unaff_retaddr);
  if ((val >> 0xc & 1) != 0) {
    uVar3 = val >> 0xd & 3;
    if (seg_reg == 2) {
      if (((val & 0xa00) == 0x200) && (((selector & 3U) == uVar6 && (uVar3 == uVar6)))) {
LAB_0051ede1:
        if (-1 < (short)val) {
          if (seg_reg == 2) {
            exception_index = 0xc;
          }
          else {
            exception_index = 0xb;
          }
          goto LAB_0051ef80;
        }
        if ((val >> 8 & 1) == 0) {
          val = val | 0x100;
          uVar3 = 2;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar3 = 0, (~env->hflags & 3) != 0)) {
            uVar3 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stl_mmuidx_ra_x86_64(env,aVar7,val,uVar3,unaff_retaddr);
        }
        uVar5 = val & 0xf0000 | uVar2 & 0xffff;
        uVar3 = uVar5 << 0xc | 0xfff;
        if ((val >> 0x17 & 1) == 0) {
          uVar3 = uVar5;
        }
        env->segs[seg_reg].selector = selector & 0xffffU;
        env->segs[seg_reg].base = (ulong)(val & 0xff000000 | uVar2 >> 0x10 | (val & 0xff) << 0x10);
        env->segs[seg_reg].limit = uVar3;
        env->segs[seg_reg].flags = val;
        if (seg_reg != 2) {
          if (seg_reg == 1) {
            uVar3 = env->hflags;
            if ((val >> 0x15 & 1) == 0 || (uVar3 >> 0xe & 1) == 0) {
              uVar3 = uVar3 & 0xffff7fef | env->segs[1].flags >> 0x12 & 0x10;
            }
            else {
              uVar3 = uVar3 & 0xffff7f8f | 0x8030;
            }
            env->hflags = uVar3;
          }
          goto LAB_0051ef06;
        }
        env->hflags = env->hflags & 0xfffffffc | val >> 0xd & 3;
        goto LAB_0051eefe;
      }
    }
    else if (((val & 0xa00) != 0x800) &&
            (((~val & 0xc00) == 0 || ((uVar6 <= uVar3 && ((selector & 3U) <= uVar3))))))
    goto LAB_0051ede1;
  }
  exception_index = 0xd;
LAB_0051ef80:
  raise_exception_err_ra_x86_64(env,exception_index,uVar5,unaff_retaddr);
}

Assistant:

void helper_load_seg(CPUX86State *env, int seg_reg, int selector)
{
    uint32_t e1, e2;
    int cpl, dpl, rpl;
    SegmentCache *dt;
    int index;
    target_ulong ptr;

    selector &= 0xffff;
    cpl = env->hflags & HF_CPL_MASK;
    if ((selector & 0xfffc) == 0) {
        /* null selector case */
        if (seg_reg == R_SS
#ifdef TARGET_X86_64
            && (!(env->hflags & HF_CS64_MASK) || cpl == 3)
#endif
            ) {
            raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
        }
        cpu_x86_load_seg_cache(env, seg_reg, selector, 0, 0, 0);
    } else {

        if (selector & 0x4) {
            dt = &env->ldt;
        } else {
            dt = &env->gdt;
        }
        index = selector & ~7;
        if ((index + 7) > dt->limit) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        ptr = dt->base + index;
        e1 = cpu_ldl_kernel_ra(env, ptr, GETPC());
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, GETPC());

        if (!(e2 & DESC_S_MASK)) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        rpl = selector & 3;
        dpl = (e2 >> DESC_DPL_SHIFT) & 3;
        if (seg_reg == R_SS) {
            /* must be writable segment */
            if ((e2 & DESC_CS_MASK) || !(e2 & DESC_W_MASK)) {
                raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
            }
            if (rpl != cpl || dpl != cpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
            }
        } else {
            /* must be readable segment */
            if ((e2 & (DESC_CS_MASK | DESC_R_MASK)) == DESC_CS_MASK) {
                raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
            }

            if (!(e2 & DESC_CS_MASK) || !(e2 & DESC_C_MASK)) {
                /* if not conforming code, test rights */
                if (dpl < cpl || dpl < rpl) {
                    raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
                }
            }
        }

        if (!(e2 & DESC_P_MASK)) {
            if (seg_reg == R_SS) {
                raise_exception_err_ra(env, EXCP0C_STACK, selector & 0xfffc, GETPC());
            } else {
                raise_exception_err_ra(env, EXCP0B_NOSEG, selector & 0xfffc, GETPC());
            }
        }

        /* set the access bit if not already set */
        if (!(e2 & DESC_A_MASK)) {
            e2 |= DESC_A_MASK;
            cpu_stl_kernel_ra(env, ptr + 4, e2, GETPC());
        }

        cpu_x86_load_seg_cache(env, seg_reg, selector,
                       get_seg_base(e1, e2),
                       get_seg_limit(e1, e2),
                       e2);
#if 0
        qemu_log("load_seg: sel=0x%04x base=0x%08lx limit=0x%08lx flags=%08x\n",
                selector, (unsigned long)sc->base, sc->limit, sc->flags);
#endif
    }
}